

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O1

string * __thiscall
cmGeneratorExpressionEvaluationFile::GetOutputFileName
          (string *__return_storage_ptr__,cmGeneratorExpressionEvaluationFile *this,
          cmLocalGenerator *lg,cmGeneratorTarget *target,string *config,string *lang)

{
  pointer pcVar1;
  bool bVar2;
  string *psVar3;
  string local_40;
  
  psVar3 = cmCompiledGeneratorExpression::Evaluate
                     ((this->OutputFileExpr)._M_t.
                      super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                      .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,lg
                      ,config,target,(cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0
                      ,lang);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar3->_M_string_length);
  bVar2 = cmsys::SystemTools::FileIsFullPath(__return_storage_ptr__);
  if (bVar2) {
    cmsys::SystemTools::CollapseFullPath(&local_40,__return_storage_ptr__);
  }
  else {
    FixRelativePath(&local_40,this,__return_storage_ptr__,PathForOutput,lg);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionEvaluationFile::GetOutputFileName(
  cmLocalGenerator* lg, cmGeneratorTarget* target, const std::string& config,
  const std::string& lang)
{
  std::string outputFileName =
    this->OutputFileExpr->Evaluate(lg, config, target, nullptr, nullptr, lang);

  if (cmSystemTools::FileIsFullPath(outputFileName)) {
    outputFileName = cmSystemTools::CollapseFullPath(outputFileName);
  } else {
    outputFileName = this->FixRelativePath(outputFileName, PathForOutput, lg);
  }

  return outputFileName;
}